

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ecdsa_recoverable_signature_save
               (secp256k1_ecdsa_recoverable_signature *sig,secp256k1_scalar *r,secp256k1_scalar *s,
               int recid)

{
  undefined4 in_ECX;
  long in_RDI;
  secp256k1_scalar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  *(char *)(in_RDI + 0x40) = (char)in_ECX;
  return;
}

Assistant:

static void secp256k1_ecdsa_recoverable_signature_save(secp256k1_ecdsa_recoverable_signature* sig, const secp256k1_scalar* r, const secp256k1_scalar* s, int recid) {
    if (sizeof(secp256k1_scalar) == 32) {
        memcpy(&sig->data[0], r, 32);
        memcpy(&sig->data[32], s, 32);
    } else {
        secp256k1_scalar_get_b32(&sig->data[0], r);
        secp256k1_scalar_get_b32(&sig->data[32], s);
    }
    sig->data[64] = recid;
}